

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::GetFullNameInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *outPrefix,
          string *outBase,string *outSuffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  ArtifactType artifact_00;
  char *pcVar5;
  _Alloc_hider __s;
  char *pcVar6;
  LinkClosure *pLVar7;
  long *plVar8;
  size_t sVar9;
  string *psVar10;
  size_type *psVar11;
  ulong *puVar12;
  long lVar13;
  _Alloc_hider _Var14;
  bool bVar15;
  string fw_prefix;
  size_type __dnew_1;
  string ll;
  size_type __dnew;
  string local_168;
  string local_148;
  char *local_128;
  char *local_120;
  string *local_118;
  string *local_110;
  ArtifactType local_104;
  undefined2 *local_100;
  undefined8 local_f8;
  undefined2 local_f0;
  undefined6 uStack_ee;
  string local_e0;
  char *local_c0;
  string local_b8;
  string *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if (MODULE_LIBRARY < this->Target->TargetTypeValue) {
    outPrefix->_M_string_length = 0;
    *(outPrefix->_M_dataplus)._M_p = '\0';
    std::__cxx11::string::_M_assign((string *)outBase);
    outSuffix->_M_string_length = 0;
    *(outSuffix->_M_dataplus)._M_p = '\0';
    return;
  }
  local_118 = config;
  local_110 = outBase;
  if (artifact == ImportLibraryArtifact) {
    pcVar3 = this->Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_90._M_dataplus._M_p = (pointer)0x1b;
    local_70._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_90);
    local_70.field_2._M_allocated_capacity = (size_type)local_90._M_dataplus._M_p;
    builtin_strncpy(local_70._M_dataplus._M_p,"CMAKE_IMPORT_LIBRARY_SUFFIX",0x1b);
    local_70._M_string_length = (size_type)local_90._M_dataplus._M_p;
    local_70._M_dataplus._M_p[(long)local_90._M_dataplus._M_p] = '\0';
    pcVar5 = cmMakefile::GetDefinition(pcVar3,&local_70);
    bVar15 = pcVar5 == (char *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,(ulong)(local_70.field_2._M_allocated_capacity + 1))
      ;
    }
  }
  else {
    bVar15 = false;
  }
  if (bVar15) {
    outPrefix->_M_string_length = 0;
    *(outPrefix->_M_dataplus)._M_p = '\0';
    local_110->_M_string_length = 0;
    *(local_110->_M_dataplus)._M_p = '\0';
    outSuffix->_M_string_length = 0;
    *(outSuffix->_M_dataplus)._M_p = '\0';
    return;
  }
  TVar2 = this->Target->TargetTypeValue;
  local_104 = RuntimeBinaryArtifact;
  if ((TVar2 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    local_104 = artifact;
  }
  if (TVar2 == EXECUTABLE) {
    local_104 = artifact;
  }
  local_98 = outSuffix;
  if (artifact == ImportLibraryArtifact) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90.field_2._M_allocated_capacity._0_5_ = 0x524f504d49;
    local_90.field_2._M_allocated_capacity._5_3_ = 0x505f54;
    local_90.field_2._8_5_ = 0x5849464552;
    local_90._M_string_length = 0xd;
    local_90.field_2._M_local_buf[0xd] = '\0';
    __s._M_p = GetProperty(this,&local_90);
    psVar10 = local_118;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT35(local_90.field_2._M_allocated_capacity._5_3_,
                               local_90.field_2._M_allocated_capacity._0_5_) + 1);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50.field_2._M_allocated_capacity._0_5_ = 0x524f504d49;
    local_50.field_2._M_allocated_capacity._5_3_ = 0x535f54;
    local_50.field_2._8_5_ = 0x5849464655;
    local_50._M_string_length = 0xd;
    local_50.field_2._M_local_buf[0xd] = '\0';
    local_128 = GetProperty(this,&local_50);
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8.field_2._M_allocated_capacity._0_4_ = 0x46455250;
    local_b8.field_2._M_allocated_capacity._4_2_ = 0x5849;
    local_b8._M_string_length = 6;
    local_b8.field_2._M_local_buf[6] = '\0';
    __s._M_p = GetProperty(this,&local_b8);
    psVar10 = local_118;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT17(local_b8.field_2._M_local_buf[7],
                               CONCAT16(local_b8.field_2._M_local_buf[6],
                                        CONCAT24(local_b8.field_2._M_allocated_capacity._4_2_,
                                                 local_b8.field_2._M_allocated_capacity._0_4_))) + 1
                     );
    }
    local_b8.field_2._M_allocated_capacity._0_4_ = 0x46465553;
    local_b8.field_2._M_allocated_capacity._4_2_ = 0x5849;
    local_b8._M_string_length = 6;
    local_b8.field_2._M_local_buf[6] = '\0';
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_128 = GetProperty(this,&local_b8);
  }
  if (artifact == ImportLibraryArtifact) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_002e687e;
    lVar13 = CONCAT35(local_50.field_2._M_allocated_capacity._5_3_,
                      local_50.field_2._M_allocated_capacity._0_5_);
    _Var14._M_p = local_50._M_dataplus._M_p;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_002e687e;
    lVar13 = CONCAT17(local_b8.field_2._M_local_buf[7],
                      CONCAT16(local_b8.field_2._M_local_buf[6],
                               CONCAT24(local_b8.field_2._M_allocated_capacity._4_2_,
                                        local_b8.field_2._M_allocated_capacity._0_4_)));
    _Var14._M_p = local_b8._M_dataplus._M_p;
  }
  operator_delete(_Var14._M_p,lVar13 + 1);
LAB_002e687e:
  if (psVar10->_M_string_length == 0) {
    local_c0 = (char *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase(&local_e0,psVar10);
    std::__cxx11::string::append((char *)&local_e0);
    pcVar5 = GetProperty(this,&local_e0);
    if (((pcVar5 == (char *)0x0) || (bVar15 = IsAppBundleOnApple(this), bVar15)) ||
       (bVar15 = IsFrameworkOnApple(this), bVar15)) {
      pcVar5 = (char *)0x0;
    }
    local_c0 = pcVar5;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  artifact_00 = local_104;
  pcVar6 = cmTarget::GetPrefixVariableInternal(this->Target,local_104);
  local_120 = cmTarget::GetSuffixVariableInternal(this->Target,artifact_00);
  pLVar7 = GetLinkClosure(this,local_118);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  pcVar4 = (pLVar7->LinkerLanguage)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,pcVar4,pcVar4 + (pLVar7->LinkerLanguage)._M_string_length);
  pcVar5 = local_120;
  if (local_e0._M_string_length != 0) {
    if ((local_128 == (char *)0x0) && (local_120 != (char *)0x0)) {
      if (*local_120 == '\0') {
        local_128 = (char *)0x0;
      }
      else {
        local_100 = &local_f0;
        local_f0 = 0x5f;
        local_f8 = 1;
        strlen(local_120);
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_100,0,(char *)0x0,(ulong)pcVar5);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_148.field_2._M_allocated_capacity = *psVar11;
          local_148.field_2._8_8_ = plVar8[3];
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar11;
          local_148._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_148._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_148,(ulong)local_e0._M_dataplus._M_p);
        puVar12 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_168.field_2._M_allocated_capacity = *puVar12;
          local_168.field_2._8_8_ = plVar8[3];
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *puVar12;
          local_168._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_168._M_string_length = plVar8[1];
        *plVar8 = (long)puVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,CONCAT62(uStack_ee,local_f0) + 1);
        }
        local_128 = cmMakefile::GetDefinition(this->Makefile,&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)__s._M_p ==
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) && (pcVar6 != (char *)0x0)) {
      if (*pcVar6 == '\0') {
        __s._M_p = (pointer)0x0;
      }
      else {
        local_100 = &local_f0;
        local_f0 = 0x5f;
        local_f8 = 1;
        strlen(pcVar6);
        plVar8 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_100,0,(char *)0x0,(ulong)pcVar6);
        psVar11 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_148.field_2._M_allocated_capacity = *psVar11;
          local_148.field_2._8_8_ = plVar8[3];
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        }
        else {
          local_148.field_2._M_allocated_capacity = *psVar11;
          local_148._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_148._M_string_length = plVar8[1];
        *plVar8 = (long)psVar11;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_148,(ulong)local_e0._M_dataplus._M_p);
        puVar12 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_168.field_2._M_allocated_capacity = *puVar12;
          local_168.field_2._8_8_ = plVar8[3];
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *puVar12;
          local_168._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_168._M_string_length = plVar8[1];
        *plVar8 = (long)puVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_100 != &local_f0) {
          operator_delete(local_100,CONCAT62(uStack_ee,local_f0) + 1);
        }
        __s._M_p = cmMakefile::GetDefinition(this->Makefile,&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  if ((pcVar6 != (char *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    pcVar3 = this->Makefile;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    sVar9 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,pcVar6,pcVar6 + sVar9);
    psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_168);
    __s._M_p = (psVar10->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar5 = local_120;
  if ((local_120 != (char *)0x0) && (local_128 == (char *)0x0)) {
    pcVar3 = this->Makefile;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    sVar9 = strlen(local_120);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,pcVar5,pcVar5 + sVar9);
    psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&local_168);
    local_128 = (psVar10->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
  }
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity =
       local_168.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar15 = IsFrameworkOnApple(this);
  if (bVar15) {
    GetFrameworkDirectory(&local_148,this,local_118,ContentLevel);
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_168);
    local_128 = (char *)0x0;
    __s._M_p = local_168._M_dataplus._M_p;
  }
  bVar15 = IsCFBundleOnApple(this);
  if (bVar15) {
    GetCFBundleDirectory(&local_148,this,local_118,FullLevel);
    std::__cxx11::string::operator=((string *)&local_168,(string *)&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_168);
    local_128 = (char *)0x0;
    __s._M_p = local_168._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    __s._M_p = "";
  }
  pcVar5 = (char *)outPrefix->_M_string_length;
  strlen(__s._M_p);
  std::__cxx11::string::_M_replace((ulong)outPrefix,0,pcVar5,(ulong)__s._M_p);
  GetOutputName(&local_148,this,local_118,local_104);
  std::__cxx11::string::_M_append((char *)local_110,(ulong)local_148._M_dataplus._M_p);
  paVar1 = &local_148.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)local_110);
  local_148.field_2._M_allocated_capacity = 0x4f49535245564f53;
  local_148.field_2._8_2_ = 0x4e;
  local_148._M_string_length = 9;
  local_148._M_dataplus._M_p = (pointer)paVar1;
  pcVar5 = GetProperty(this,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != paVar1) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if (pcVar5 != (char *)0x0) {
    if (this->Target->TargetTypeValue == SHARED_LIBRARY && artifact != ImportLibraryArtifact) {
      pcVar3 = this->Makefile;
      local_100 = (undefined2 *)0x26;
      local_148._M_dataplus._M_p = (pointer)paVar1;
      local_148._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_148,(ulong)&local_100);
      local_148.field_2._M_allocated_capacity = (size_type)local_100;
      *(undefined8 *)((long)local_148._M_dataplus._M_p + 0x10) = 0x4d414e5f59524152;
      *(undefined8 *)((long)local_148._M_dataplus._M_p + 0x18) = 0x565f485449575f45;
      *(undefined8 *)local_148._M_dataplus._M_p = 0x48535f454b414d43;
      *(undefined8 *)((long)local_148._M_dataplus._M_p + 8) = 0x42494c5f44455241;
      builtin_strncpy((char *)((long)local_148._M_dataplus._M_p + 0x1e),"_VERSION",8);
      local_148._M_string_length = (size_type)local_100;
      local_148._M_dataplus._M_p[(long)local_100] = '\0';
      bVar15 = cmMakefile::IsOn(pcVar3,&local_148);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != paVar1) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar15 = false;
    }
    if (bVar15 != false) {
      std::__cxx11::string::append((char *)local_110);
      std::__cxx11::string::append((char *)local_110);
    }
  }
  psVar10 = local_98;
  pcVar5 = "";
  if (local_128 != (char *)0x0) {
    pcVar5 = local_128;
  }
  pcVar6 = (char *)local_98->_M_string_length;
  strlen(pcVar5);
  std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar6,(ulong)pcVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetFullNameInternal(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  std::string& outPrefix, std::string& outBase, std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    outPrefix.clear();
    outBase = this->GetName();
    outSuffix.clear();
    return;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    outPrefix.clear();
    outBase.clear();
    outSuffix.clear();
    return;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute the full name for main target types.
  const char* targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));
  const char* targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));
  const char* configPostfix = nullptr;
  if (!config.empty()) {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if (configPostfix &&
        (this->IsAppBundleOnApple() || this->IsFrameworkOnApple())) {
      configPostfix = nullptr;
    }
  }
  const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
  const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    if (!targetSuffix && suffixVar && *suffixVar) {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
    }
    if (!targetPrefix && prefixVar && *prefixVar) {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }
  }

  // if there is no prefix on the target use the cmake definition
  if (!targetPrefix && prefixVar) {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar).c_str();
  }
  // if there is no suffix on the target use the cmake definition
  if (!targetSuffix && suffixVar) {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar).c_str();
  }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if (this->IsFrameworkOnApple()) {
    fw_prefix = this->GetFrameworkDirectory(config, ContentLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  if (this->IsCFBundleOnApple()) {
    fw_prefix = this->GetCFBundleDirectory(config, FullLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix ? targetPrefix : "";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, artifact);

  // Append the per-configuration postfix.
  outBase += configPostfix ? configPostfix : "";

  // Name shared libraries with their version number on some platforms.
  if (const char* soversion = this->GetProperty("SOVERSION")) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY &&
        !isImportedLibraryArtifact &&
        this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION")) {
      outBase += "-";
      outBase += soversion;
    }
  }

  // Append the suffix.
  outSuffix = targetSuffix ? targetSuffix : "";
}